

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void FStat::DumpRegisteredStats(void)

{
  char local_11;
  FStat *local_10;
  FStat *stat;
  
  local_10 = FirstStat;
  Printf("Available stats:\n");
  for (; local_10 != (FStat *)0x0; local_10 = local_10->m_Next) {
    local_11 = '*';
    if ((local_10->m_Active & 1U) == 0) {
      local_11 = ' ';
    }
    Printf(" %c%s\n",(ulong)(uint)(int)local_11,local_10->m_Name);
  }
  return;
}

Assistant:

void FStat::DumpRegisteredStats ()
{
	FStat *stat = FirstStat;

	Printf ("Available stats:\n");
	while (stat)
	{
		Printf (" %c%s\n", stat->m_Active ? '*' : ' ', stat->m_Name);
		stat = stat->m_Next;
	}
}